

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::OwnFd> __thiscall kj::AsyncCapabilityStream::receiveFd(AsyncCapabilityStream *this)

{
  _func_int *p_Var1;
  SourceLocation location;
  AsyncInputStream AVar2;
  void *pvVar3;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode intermediate;
  AsyncCapabilityStream local_58;
  AsyncInputStream local_48;
  undefined *local_40;
  undefined *puStack_38;
  undefined8 local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  tryReceiveFd(&local_58);
  p_Var1 = local_58.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_58.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)p_Var1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2630:30)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00676da8;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_58.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] = (_func_int *)0x0
    ;
    this_00 = (TransformPromiseNodeBase *)
              (local_58.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2630:30)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_58.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[-5] =
         (_func_int *)&PTR_destroy_00676da8;
    local_58.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[-4] = p_Var1;
  }
  local_40 = &DAT_0042a172;
  puStack_38 = &DAT_0042a1d1;
  local_30 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_58.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)this_00;
  kj::_::maybeChain<kj::OwnFd>
            ((OwnPromiseNode *)&local_48,
             (Promise<kj::OwnFd> *)&local_58.super_AsyncIoStream.super_AsyncOutputStream,location);
  AVar2._vptr_AsyncInputStream = local_48._vptr_AsyncInputStream;
  local_48._vptr_AsyncInputStream = (_func_int **)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       AVar2._vptr_AsyncInputStream;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
             &local_58.super_AsyncIoStream.super_AsyncOutputStream);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_58);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<OwnFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<OwnFd>&& result) -> Promise<OwnFd> {
    KJ_IF_SOME(r, result) {
      return kj::mv(r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}